

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

GeneratorVirtualScriptFunction * __thiscall
Js::JavascriptLibrary::CreateGeneratorVirtualScriptFunction
          (JavascriptLibrary *this,FunctionProxy *proxy)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  ScriptFunctionType *type;
  Recycler *pRVar5;
  undefined4 *puVar6;
  FunctionWithComputedName<Js::FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction>_> *this_00;
  FunctionWithComputedName<Js::GeneratorVirtualScriptFunction> *this_01;
  FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction> *this_02;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  type = FunctionProxy::EnsureDeferredPrototypeType(proxy);
  TVar1 = ((proxy->functionInfo).ptr)->attributes;
  if ((TVar1 & (HomeObj|ComputedName)) == None) {
    local_50 = (undefined1  [8])&GeneratorVirtualScriptFunction::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_766a001;
    data.filename._0_4_ = 0x192d;
    pRVar5 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_50);
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                  ,0xa63,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00c00ef6;
      *puVar6 = 0;
    }
    this_01 = (FunctionWithComputedName<Js::GeneratorVirtualScriptFunction> *)
              Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)1,false>
                        (pRVar5,0x50);
    if (this_01 == (FunctionWithComputedName<Js::GeneratorVirtualScriptFunction> *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                  ,0xa70,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) goto LAB_00c00ef6;
      *puVar6 = 0;
    }
    ScriptFunction::ScriptFunction((ScriptFunction *)this_01,proxy,type);
    (this_01->super_GeneratorVirtualScriptFunction).super_ScriptFunction.super_ScriptFunctionBase.
    super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.super_FinalizableObject =
         (FinalizableObject)&PTR_Finalize_01511da0;
    (this_01->super_GeneratorVirtualScriptFunction).realFunction.ptr =
         (JavascriptGeneratorFunction *)0x0;
  }
  else {
    if ((~TVar1 & 0x2800000) == 0) {
      local_50 = (undefined1  [8])
                 &FunctionWithComputedName<Js::FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction>>
                  ::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_766a001;
      data.filename._0_4_ = 0x1925;
      pRVar5 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_50);
      BVar4 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                    ,0xa63,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar3) goto LAB_00c00ef6;
        *puVar6 = 0;
      }
      this_00 = (FunctionWithComputedName<Js::FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction>_>
                 *)Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)1,false>
                             (pRVar5,0x60);
      if (this_00 ==
          (FunctionWithComputedName<Js::FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction>_> *)
          0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                    ,0xa70,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar3) goto LAB_00c00ef6;
        *puVar6 = 0;
      }
      FunctionWithComputedName<Js::FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction>_>::
      FunctionWithComputedName(this_00,proxy,type);
      return (GeneratorVirtualScriptFunction *)this_00;
    }
    if ((TVar1 >> 0x19 & 1) != 0) {
      local_50 = (undefined1  [8])&FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction>::typeinfo
      ;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_766a001;
      data.filename._0_4_ = 0x1929;
      pRVar5 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_50);
      BVar4 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar4 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                    ,0xa63,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar3) goto LAB_00c00ef6;
        *puVar6 = 0;
      }
      this_02 = (FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction> *)
                Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)1,false>
                          (pRVar5,0x58);
      if (this_02 == (FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction> *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                    ,0xa70,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar3) goto LAB_00c00ef6;
        *puVar6 = 0;
      }
      FunctionWithHomeObj<Js::GeneratorVirtualScriptFunction>::FunctionWithHomeObj
                (this_02,proxy,type);
      return &this_02->super_GeneratorVirtualScriptFunction;
    }
    local_50 = (undefined1  [8])
               &FunctionWithComputedName<Js::GeneratorVirtualScriptFunction>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_766a001;
    data.filename._0_4_ = 0x192b;
    pRVar5 = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_50);
    BVar4 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar4 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                  ,0xa63,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar3) goto LAB_00c00ef6;
      *puVar6 = 0;
    }
    this_01 = (FunctionWithComputedName<Js::GeneratorVirtualScriptFunction> *)
              Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)1,false>
                        (pRVar5,0x58);
    if (this_01 == (FunctionWithComputedName<Js::GeneratorVirtualScriptFunction> *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.h"
                                  ,0xa70,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar3) {
LAB_00c00ef6:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    FunctionWithComputedName<Js::GeneratorVirtualScriptFunction>::FunctionWithComputedName
              (this_01,proxy,type);
  }
  return &this_01->super_GeneratorVirtualScriptFunction;
}

Assistant:

GeneratorVirtualScriptFunction* JavascriptLibrary::CreateGeneratorVirtualScriptFunction(FunctionProxy * proxy)
    {
        ScriptFunctionType* deferredPrototypeType = proxy->EnsureDeferredPrototypeType();
        FunctionInfo* functionInfo = proxy->GetFunctionInfo();
        if (functionInfo->HasComputedName() || functionInfo->HasHomeObj())
        {
            if (functionInfo->HasComputedName() && functionInfo->HasHomeObj())
            {
                return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, FunctionWithComputedName<FunctionWithHomeObj<GeneratorVirtualScriptFunction>>, proxy, deferredPrototypeType);
            }
            else if (functionInfo->HasHomeObj())
            {
                return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, FunctionWithHomeObj<GeneratorVirtualScriptFunction>, proxy, deferredPrototypeType);
            }
            return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, GeneratorVirtualScriptFunctionWithComputedName, proxy, deferredPrototypeType);
        }
        return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, GeneratorVirtualScriptFunction, proxy, deferredPrototypeType);
    }